

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url-test.c++
# Opt level: O0

Url * kj::anon_unknown_0::parseAndCheck
                (Url *__return_storage_ptr__,StringPtr originalText,StringPtr expectedRestringified,
                Options options)

{
  bool bVar1;
  int __flags;
  char *pcVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  void *extraout_RDX_01;
  Url *params_00;
  char *__arg;
  Url *pUVar3;
  StringPtr url_00;
  bool local_171;
  undefined1 local_170 [7];
  bool _kj_shouldLog_1;
  undefined1 local_158 [8];
  Url clone;
  bool _kj_shouldLog;
  String local_68;
  Options local_4a;
  size_t local_48;
  char *pcStack_40;
  byte local_33;
  Options local_32;
  undefined1 auStack_30 [6];
  Options options_local;
  StringPtr expectedRestringified_local;
  StringPtr originalText_local;
  Url *url;
  Url *params;
  
  expectedRestringified_local.content.ptr = (char *)expectedRestringified.content.size_;
  _auStack_30 = expectedRestringified.content.ptr;
  url_00.content.ptr = (char *)originalText.content.size_;
  expectedRestringified_local.content.size_ = (size_t)originalText.content.ptr;
  pUVar3 = __return_storage_ptr__;
  local_32 = options;
  bVar1 = StringPtr::operator==((StringPtr *)auStack_30,(void *)0x0);
  if (bVar1) {
    _auStack_30 = (char *)expectedRestringified_local.content.size_;
    expectedRestringified_local.content.ptr = url_00.content.ptr;
  }
  local_33 = 0;
  local_48 = expectedRestringified_local.content.size_;
  local_4a = local_32;
  __arg = (char *)(ulong)(ushort)local_32;
  pcVar2 = (char *)0x0;
  url_00.content.size_ = 0;
  pcStack_40 = url_00.content.ptr;
  Url::parse(__return_storage_ptr__,(Url *)expectedRestringified_local.content.size_,url_00,
             (uint)(ushort)local_32,SUB82(pUVar3,0));
  str<kj::Url&>(&local_68,(kj *)__return_storage_ptr__,params);
  bVar1 = String::operator==(&local_68,(StringPtr *)auStack_30);
  String::~String(&local_68);
  __flags = (int)pcVar2;
  __child_stack = extraout_RDX;
  if (!bVar1) {
    clone._219_1_ = _::Debug::shouldLog(ERROR);
    __child_stack = extraout_RDX_00;
    while (__flags = (int)pcVar2, clone._219_1_ != '\0') {
      pcVar2 = 
      "\"failed: expected \" \"kj::str(url) == expectedRestringified\", url, originalText, expectedRestringified"
      ;
      __arg = "failed: expected kj::str(url) == expectedRestringified";
      _::Debug::log<char_const(&)[55],kj::Url&,kj::StringPtr&,kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x21,ERROR,
                 "\"failed: expected \" \"kj::str(url) == expectedRestringified\", url, originalText, expectedRestringified"
                 ,(char (*) [55])"failed: expected kj::str(url) == expectedRestringified",
                 __return_storage_ptr__,(StringPtr *)&expectedRestringified_local.content.size_,
                 (StringPtr *)auStack_30);
      __child_stack = extraout_RDX_01;
      clone._219_1_ = 0;
    }
  }
  Url::clone((Url *)local_158,(__fn *)__return_storage_ptr__,__child_stack,__flags,__arg);
  str<kj::Url&>((String *)local_170,(kj *)local_158,params_00);
  bVar1 = String::operator==((String *)local_170,(StringPtr *)auStack_30);
  String::~String((String *)local_170);
  if (!bVar1) {
    local_171 = _::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      _::Debug::log<char_const(&)[57],kj::Url&,kj::StringPtr&,kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x24,ERROR,
                 "\"failed: expected \" \"kj::str(clone) == expectedRestringified\", clone, originalText, expectedRestringified"
                 ,(char (*) [57])"failed: expected kj::str(clone) == expectedRestringified",
                 (Url *)local_158,(StringPtr *)&expectedRestringified_local.content.size_,
                 (StringPtr *)auStack_30);
      local_171 = false;
    }
  }
  local_33 = 1;
  Url::~Url((Url *)local_158);
  if ((local_33 & 1) == 0) {
    Url::~Url(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Url parseAndCheck(kj::StringPtr originalText, kj::StringPtr expectedRestringified = nullptr,
                  Url::Options options = {}) {
  if (expectedRestringified == nullptr) expectedRestringified = originalText;
  auto url = Url::parse(originalText, Url::REMOTE_HREF, options);
  KJ_EXPECT(kj::str(url) == expectedRestringified, url, originalText, expectedRestringified);
  // Make sure clones also restringify to the expected string.
  auto clone = url.clone();
  KJ_EXPECT(kj::str(clone) == expectedRestringified, clone, originalText, expectedRestringified);
  return url;
}